

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.cpp
# Opt level: O0

piksel * __thiscall piksel::readFile(piksel *this,string *filename)

{
  undefined8 uVar1;
  streambuf *psVar2;
  stringstream local_3a8 [8];
  stringstream ss;
  ostream local_398 [376];
  undefined1 local_220 [8];
  ifstream ifs;
  string *filename_local;
  
  uVar1 = std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_220,uVar1,8);
  std::__cxx11::stringstream::stringstream(local_3a8);
  psVar2 = (streambuf *)std::ifstream::rdbuf();
  std::ostream::operator<<(local_398,psVar2);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_3a8);
  std::ifstream::~ifstream(local_220);
  return this;
}

Assistant:

std::string readFile(const std::string& filename) {
    std::ifstream ifs(filename.c_str());
    std::stringstream ss;
    ss << ifs.rdbuf();
    return ss.str();
}